

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O2

void __thiscall
MathML::AST::ConstantExpression::arithmeticalBinaryOperation
          (ConstantExpression *this,ConstantExpression *result,ConstantExpression *rhs,Operator op)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double val2;
  double val1;
  allocator<char> local_79;
  String local_78;
  Error local_58;
  
  iVar1 = (*(this->super_INode)._vptr_INode[9])();
  if ((iVar1 == 0) || (iVar1 = (*(rhs->super_INode)._vptr_INode[9])(rhs), iVar1 == 0)) {
    if (this->mErrorHandler != (ErrorHandler *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"uninitilized operand(s)",&local_79);
      Error::Error(&local_58,ERR_INVALIDPARAMS,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      (**(code **)(*(long *)this->mErrorHandler + 0x10))(this->mErrorHandler,&local_58);
      Error::~Error(&local_58);
    }
    (*(result->super_INode)._vptr_INode[6])(0,result);
    return;
  }
  iVar1 = (*(this->super_INode)._vptr_INode[9])(this);
  if ((((iVar1 != 1) || (iVar1 = (*(rhs->super_INode)._vptr_INode[9])(rhs), iVar1 != 2)) &&
      ((iVar1 = (*(this->super_INode)._vptr_INode[9])(this), iVar1 != 2 ||
       (iVar1 = (*(rhs->super_INode)._vptr_INode[9])(rhs), iVar1 != 1)))) &&
     ((iVar1 = (*(this->super_INode)._vptr_INode[9])(this), iVar1 != 2 ||
      (iVar1 = (*(rhs->super_INode)._vptr_INode[9])(rhs), iVar1 != 2)))) {
    (*(this->super_INode)._vptr_INode[10])(this);
    (*(rhs->super_INode)._vptr_INode[10])(rhs);
    arithmeticalBinaryOperation<double>(this,result,(double *)&local_58,(double *)&local_78,op);
    return;
  }
  iVar1 = (*(this->super_INode)._vptr_INode[0xb])(this);
  local_58._vptr_Error = (_func_int **)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(rhs->super_INode)._vptr_INode[0xb])(rhs);
  local_78._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar1);
  arithmeticalBinaryOperation<long>(this,result,(long *)&local_58,(long *)&local_78,op);
  return;
}

Assistant:

void ConstantExpression::arithmeticalBinaryOperation( ConstantExpression& result, const ConstantExpression& rhs, AST::ArithmeticExpression::Operator op ) const
        {
            if ( this->getType() == SCALAR_INVALID || rhs.getType() == SCALAR_INVALID )
            {
                if ( mErrorHandler )
                {
                    Error error( Error::ERR_INVALIDPARAMS, "uninitilized operand(s)" );
                    mErrorHandler->handleError( &error );
                }
                result.setValue( 0. );
                return;
            }

            else if ( (this->getType() == SCALAR_BOOL && rhs.getType() == SCALAR_LONG) || (this->getType() == SCALAR_LONG && rhs.getType() == SCALAR_BOOL) )
            {				
				long val1 = this->getLongValue();
				long val2 = rhs.getLongValue();
				arithmeticalBinaryOperation( result, val1, val2, op );
            }

            else if ( this->getType() == SCALAR_LONG && rhs.getType() == SCALAR_LONG )
            {
                long val1 = this->getLongValue();
                long val2 = rhs.getLongValue();
                arithmeticalBinaryOperation( result, val1, val2, op );
            }

            else
            {
                double val1 = this->getDoubleValue();
                double val2 = rhs.getDoubleValue();
                arithmeticalBinaryOperation( result, val1, val2, op );
            }
        }